

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O3

char * ExportLabelToSld(char *naam,SLabelTableEntry *label)

{
  char *__src;
  char cVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  EType EVar6;
  size_t sVar7;
  char *pcVar8;
  char *p;
  char *__s2;
  uint uVar9;
  bool bVar10;
  uint *local_48;
  
  if (label == (SLabelTableEntry *)0x0) {
    __assert_fail("nullptr != label",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/tables.cpp"
                  ,0x7e,"char *ExportLabelToSld(const char *, const SLabelTableEntry *)");
  }
  cVar1 = *naam;
  p = naam + (cVar1 == '!');
  bVar10 = false;
  if ((cVar1 == '@') && (bVar10 = false, macrolabp != (char *)0x0)) {
    bVar10 = naam[1] == '.';
    if (bVar10) {
      p = naam + 1;
    }
  }
  bVar4 = isLabelStart(p,true);
  if (!bVar4) {
    __assert_fail("isLabelStart(naam)",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/tables.cpp"
                  ,0x85,"char *ExportLabelToSld(const char *, const SLabelTableEntry *)");
  }
  cVar2 = *p;
  __src = p + 1;
  if (cVar2 == '.') {
    p = __src;
  }
  if (cVar2 == '@') {
    p = __src;
  }
  bVar10 = (!bVar10 && cVar2 == '.') && macrolabp != (char *)0x0;
  if ((bVar10) || (cVar2 == '@')) {
    uVar9 = label->traits;
    sldLabelExport[0] = '\0';
    bVar4 = ModuleName[0] != '\0';
  }
  else {
    uVar9 = label->traits;
    sldLabelExport[0] = '\0';
    if (ModuleName[0] == '\0') {
      bVar4 = false;
    }
    else {
      strncat(sldLabelExport,ModuleName,0x800);
      bVar4 = true;
    }
  }
  local_48 = &label->traits;
  sVar7 = strlen(sldLabelExport);
  pcVar3 = vorlabp;
  pcVar8 = vorlabp;
  if (bVar10) {
    pcVar8 = macrolabp;
  }
  __s2 = p;
  if (cVar2 == '.') {
    __s2 = pcVar8;
  }
  if ((uVar9 & 0x18) == 0) {
    __s2 = pcVar8;
  }
  (sldLabelExport + sVar7)[0] = ',';
  (sldLabelExport + sVar7)[1] = '\0';
  if (cVar1 == '!') {
    __s2 = p;
  }
  if ((pcVar3 == __s2) && (bVar4)) {
    sVar7 = strlen(ModuleName);
    iVar5 = strncmp(ModuleName,__s2,sVar7);
    if (iVar5 == 0) {
      __s2 = __s2 + sVar7 + 1;
    }
  }
  strncat(sldLabelExport,__s2,0x40);
  sVar7 = strlen(sldLabelExport);
  (sldLabelExport + sVar7)[0] = ',';
  (sldLabelExport + sVar7)[1] = '\0';
  if (cVar2 == '.') {
    strncat(sldLabelExport,__src,0x40);
  }
  if ((*local_48 & 4) != 0) {
    sVar7 = strlen(sldLabelExport);
    builtin_strncpy(sldLabelExport + sVar7,",+eq",4);
    (sldLabelExport + sVar7 + 4)[0] = 'u';
    (sldLabelExport + sVar7 + 4)[1] = '\0';
  }
  if (bVar10) {
    sVar7 = strlen(sldLabelExport);
    builtin_strncpy(sldLabelExport + sVar7,",+macro",8);
  }
  if ((*local_48 & 0x80) != 0) {
    sVar7 = strlen(sldLabelExport);
    builtin_strncpy(sldLabelExport + sVar7,",+sm",4);
    (sldLabelExport + sVar7 + 4)[0] = 'c';
    (sldLabelExport + sVar7 + 4)[1] = '\0';
  }
  EVar6 = label->isRelocatable;
  if (EVar6 == REGULAR) {
    sVar7 = strlen(sldLabelExport);
    builtin_strncpy(sldLabelExport + sVar7,",+reloc",8);
    EVar6 = label->isRelocatable;
  }
  if (EVar6 == HIGH) {
    sVar7 = strlen(sldLabelExport);
    builtin_strncpy(sldLabelExport + sVar7,",+reloc_",8);
    builtin_strncpy(sldLabelExport + sVar7 + 5,"oc_high",8);
  }
  if (label->used == true) {
    sVar7 = strlen(sldLabelExport);
    builtin_strncpy(sldLabelExport + sVar7,",+us",4);
    builtin_strncpy(sldLabelExport + sVar7 + 3,"sed",4);
  }
  uVar9 = *local_48;
  if ((uVar9 & 8) != 0) {
    sVar7 = strlen(sldLabelExport);
    builtin_strncpy(sldLabelExport + sVar7,",+struct",8);
    builtin_strncpy(sldLabelExport + sVar7 + 5,"uct_def",8);
    uVar9 = *local_48;
  }
  if ((uVar9 & 0x10) != 0) {
    sVar7 = strlen(sldLabelExport);
    builtin_strncpy(sldLabelExport + sVar7,",+struct",8);
    builtin_strncpy(sldLabelExport + sVar7 + 6,"ct_data",8);
  }
  return sldLabelExport;
}

Assistant:

char* ExportLabelToSld(const char* naam, const SLabelTableEntry* label) {
	// does re-parse the original source line again similarly to ValidateLabel
	// but prepares SLD 'L'-type line, with module/main/local comma separated + usage traits info
	assert(nullptr != label);
	// check if this is setting namespace
	bool setNameSpace = ('!' != *naam);
	if (!setNameSpace) ++naam;
	// check if local label defined inside macro wants to become non-macro local label
	const bool escMacro = setNameSpace && macrolabp && ('@' == naam[0]) && ('.' == naam[1]);
	if (escMacro) ++naam;			// such extra "@" is consumed right here and only '.' is left
	assert(isLabelStart(naam));		// this should be called only when ValidateLabel did succeed
	const bool global = '@' == *naam;
	const bool local = '.' == *naam;
	if (global || local) ++naam;	// single modifier is parsed
	const bool inMacro = !escMacro && local && macrolabp;
	const bool inModule = !inMacro && !global && ModuleName[0];
	const bool isStructLabel = (label->traits & (LABEL_IS_STRUCT_D|LABEL_IS_STRUCT_E));
	// build fully qualified SLD info
	sldLabelExport[0] = 0;
	// module part
	if (inModule) STRCAT(sldLabelExport, LINEMAX, ModuleName);
	STRCAT(sldLabelExport, 2, ",");
	// main label part (the `vorlabp` is already the current label, if it was main label)
	// except for structure labels: the inner ones don't "set namespace" == vorlabp, use "naam" then
	// (but only if the main label of structure itself is not local, if it's local, use vorlabp)
	const char* mainLabel = isStructLabel && !local ? naam : inMacro ? macrolabp : vorlabp;
	if (!setNameSpace) mainLabel = naam;
	if (vorlabp == mainLabel && ModuleName[0]) {	// vorlabp now contains also module part, skip it
		auto modNameSz = strlen(ModuleName);
		if (0 == strncmp(ModuleName, mainLabel, modNameSz)) mainLabel += modNameSz + 1;
	}
	STRCAT(sldLabelExport, LABMAX, mainLabel);
	STRCAT(sldLabelExport, 2, ",");
	// local part
	if (local) STRCAT(sldLabelExport, LABMAX, naam);
	// usage traits
	if (label->traits&LABEL_IS_EQU) STRCAT(sldLabelExport, 20, ",+equ");
	if (inMacro) STRCAT(sldLabelExport, 20, ",+macro");
	if (label->traits&LABEL_IS_SMC) STRCAT(sldLabelExport, 20, ",+smc");
	if (Relocation::REGULAR == label->isRelocatable) STRCAT(sldLabelExport, 20, ",+reloc");
	if (Relocation::HIGH == label->isRelocatable) STRCAT(sldLabelExport, 20, ",+reloc_high");
	if (label->used) STRCAT(sldLabelExport, 20, ",+used");
	if (label->traits&LABEL_IS_STRUCT_D) STRCAT(sldLabelExport, 20, ",+struct_def");
	if (label->traits&LABEL_IS_STRUCT_E) STRCAT(sldLabelExport, 20, ",+struct_data");
	return sldLabelExport;
}